

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

U32 ZSTD_equivalentParams
              (ZSTD_CCtx_params params1,ZSTD_CCtx_params params2,size_t buffSize1,size_t blockSize1,
              ZSTD_buffered_policy_e buffPol2,U64 pledgedSrcSize)

{
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  ldmParams_t ldmParams1;
  ZSTD_compressionParameters cParams2_00;
  ldmParams_t ldmParams2;
  U32 UVar1;
  U64 in_RCX;
  ZSTD_buffered_policy_e in_EDX;
  size_t in_RSI;
  size_t in_RDI;
  undefined8 in_stack_0000000c;
  undefined8 in_stack_00000014;
  undefined8 in_stack_0000001c;
  ZSTD_strategy in_stack_00000024;
  undefined8 in_stack_0000004c;
  undefined8 in_stack_00000054;
  undefined8 in_stack_0000005c;
  undefined8 in_stack_00000084;
  undefined8 in_stack_0000008c;
  undefined8 in_stack_00000094;
  ZSTD_strategy in_stack_0000009c;
  undefined8 in_stack_000000c4;
  undefined8 in_stack_000000cc;
  undefined4 uStack00000000000000d4;
  undefined4 uStack00000000000000d8;
  undefined1 local_b1;
  
  cParams1._8_8_ = in_stack_00000014;
  cParams1._0_8_ = in_stack_0000000c;
  cParams1._16_8_ = in_stack_0000001c;
  cParams1.strategy = in_stack_00000024;
  cParams2._8_8_ = in_stack_0000008c;
  cParams2._0_8_ = in_stack_00000084;
  cParams2._16_8_ = in_stack_00000094;
  cParams2.strategy = in_stack_0000009c;
  UVar1 = ZSTD_equivalentCParams(cParams1,cParams2);
  local_b1 = false;
  if (UVar1 != 0) {
    ldmParams1._8_8_ = in_stack_00000054;
    ldmParams1._0_8_ = in_stack_0000004c;
    ldmParams1._16_8_ = in_stack_0000005c;
    ldmParams2._8_8_ = in_stack_000000cc;
    ldmParams2._0_8_ = in_stack_000000c4;
    ldmParams2.hashEveryLog = uStack00000000000000d4;
    ldmParams2.windowLog = uStack00000000000000d8;
    UVar1 = ZSTD_equivalentLdmParams(ldmParams1,ldmParams2);
    local_b1 = false;
    if (UVar1 != 0) {
      cParams2_00._8_8_ = in_stack_0000008c;
      cParams2_00._0_8_ = in_stack_00000084;
      cParams2_00._16_8_ = in_stack_00000094;
      cParams2_00.strategy = in_stack_0000009c;
      UVar1 = ZSTD_sufficientBuff(in_RDI,in_RSI,in_EDX,cParams2_00,in_RCX);
      local_b1 = UVar1 != 0;
    }
  }
  return (U32)local_b1;
}

Assistant:

static U32 ZSTD_equivalentParams(ZSTD_CCtx_params params1,
                                 ZSTD_CCtx_params params2,
                                 size_t buffSize1, size_t blockSize1,
                                 ZSTD_buffered_policy_e buffPol2,
                                 U64 pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_equivalentParams: pledgedSrcSize=%u", (U32)pledgedSrcSize);
    return ZSTD_equivalentCParams(params1.cParams, params2.cParams) &&
           ZSTD_equivalentLdmParams(params1.ldmParams, params2.ldmParams) &&
           ZSTD_sufficientBuff(buffSize1, blockSize1, buffPol2, params2.cParams, pledgedSrcSize);
}